

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetDirectoryPropertyCommand.h
# Opt level: O0

void __thiscall
cmGetDirectoryPropertyCommand::~cmGetDirectoryPropertyCommand(cmGetDirectoryPropertyCommand *this)

{
  cmGetDirectoryPropertyCommand *this_local;
  
  cmCommand::~cmCommand(&this->super_cmCommand);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmGetDirectoryPropertyCommand; }